

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::internal::ReturnAction<std::nullopt_t>::
Impl<std::nullopt_t,_std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::Impl
          (Impl<std::nullopt_t,_std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>
           *this,shared_ptr<std::nullopt_t> *value)

{
  _Optional_payload_base<unsigned_int> _Var1;
  optional<unsigned_int> local_20;
  __shared_ptr_access<std::nullopt_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  shared_ptr<std::nullopt_t> *value_local;
  Impl<std::nullopt_t,_std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>
  *this_local;
  
  local_18 = (__shared_ptr_access<std::nullopt_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)value;
  value_local = (shared_ptr<std::nullopt_t> *)this;
  ActionInterface<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::
  ActionInterface(&this->
                   super_ActionInterface<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>
                 );
  (this->super_ActionInterface<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>)
  ._vptr_ActionInterface = (_func_int **)&PTR__Impl_00501330;
  std::__shared_ptr_access<std::nullopt_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (local_18);
  std::optional<unsigned_int>::optional(&local_20);
  _Var1 = (_Optional_payload_base<unsigned_int>)ImplicitCast_<std::optional<unsigned_int>>(local_20)
  ;
  (this->value_).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> = _Var1;
  return;
}

Assistant:

explicit Impl(const std::shared_ptr<R>& value)
        : value_before_cast_(*value),
          value_(ImplicitCast_<Result>(value_before_cast_)) {}